

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshfile_operations.cpp
# Opt level: O0

void sort_element(iterator *element_iteration)

{
  int iVar1;
  int iVar2;
  pointer ppVar3;
  int local_1c;
  int n;
  int placeholder [3];
  iterator *element_iteration_local;
  
  placeholder._4_8_ = element_iteration;
  ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_elements>_>::operator->(element_iteration);
  local_1c = (ppVar3->second).element_properties[1];
  ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_elements>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_int,_elements>_> *)placeholder._4_8_);
  n = (ppVar3->second).element_properties[2];
  ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_elements>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_int,_elements>_> *)placeholder._4_8_);
  placeholder[0] = (ppVar3->second).element_properties[3];
  std::sort<int*>(&local_1c,placeholder + 1);
  iVar1 = local_1c;
  ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_elements>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_int,_elements>_> *)placeholder._4_8_);
  iVar2 = n;
  (ppVar3->second).element_properties[1] = iVar1;
  ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_elements>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_int,_elements>_> *)placeholder._4_8_);
  iVar1 = placeholder[0];
  (ppVar3->second).element_properties[2] = iVar2;
  ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_elements>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_int,_elements>_> *)placeholder._4_8_);
  (ppVar3->second).element_properties[3] = iVar1;
  return;
}

Assistant:

void sort_element(std::map<int, elements>::iterator &element_iteration)
{
    int placeholder[3]={    element_iteration->second.element_properties[1],
                            element_iteration->second.element_properties[2],
                            element_iteration->second.element_properties[3]};
    int n = sizeof(placeholder)/sizeof(placeholder[0]);
    std::sort(placeholder, placeholder+n);
    element_iteration->second.element_properties[1]= placeholder[0];
    element_iteration->second.element_properties[2]= placeholder[1];
    element_iteration->second.element_properties[3]= placeholder[2];
}